

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O1

compile_errcode __thiscall ConstantDeclaration::Generate(ConstantDeclaration *this)

{
  bool bVar1;
  SymbolName SVar2;
  compile_errcode cVar3;
  compile_errcode unaff_EBP;
  int iVar4;
  
  iVar4 = 0;
  do {
    SVar2 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (SVar2 == CONST_SYM) {
      cVar3 = ConstantDefinition::Generate(&this->m_constant_definition);
      if (cVar3 != 0) {
        unaff_EBP = -1;
        goto LAB_0014ae5b;
      }
      iVar4 = iVar4 + 1;
      bVar1 = true;
    }
    else {
      unaff_EBP = -(uint)(iVar4 < 1);
LAB_0014ae5b:
      bVar1 = false;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode ConstantDeclaration::Generate() {
    int ret = 0;
    int correct_count = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        if (name == CONST_SYM) {
            if ((ret = m_constant_definition.Generate()) == COMPILE_OK) {
                correct_count++;
            } else {
                return NOT_MATCH;
            }
        } else {
            if (correct_count > 0)
                return COMPILE_OK;
            else
                return NOT_MATCH;
        }
    }
}